

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O2

void __thiscall
QPicturePaintEngine::drawPixmap(QPicturePaintEngine *this,QRectF *r,QPixmap *pm,QRectF *sr)

{
  int *piVar1;
  QPaintEnginePrivate *pQVar2;
  int iVar3;
  QPaintEnginePrivate *pQVar4;
  long lVar5;
  int pos;
  QDataStream *pQVar6;
  
  pQVar4 = (this->super_QPaintEngine).d_ptr.d;
  piVar1 = (int *)(*(long *)&pQVar4[1].systemRect + 0x18);
  *piVar1 = *piVar1 + 1;
  pQVar2 = pQVar4 + 1;
  QDataStream::operator<<((QDataStream *)pQVar2,0x11);
  QDataStream::operator<<((QDataStream *)pQVar2,0);
  pos = QBuffer::pos();
  lVar5 = *(long *)&pQVar4[1].systemRect;
  if (*(char *)(lVar5 + 0x50) == '\x01') {
    iVar3 = *(int *)(lVar5 + 0x80);
    QList<QPixmap>::emplaceBack<QPixmap_const&>((QList<QPixmap> *)(lVar5 + 0x70),pm);
    pQVar6 = (QDataStream *)::operator<<((QDataStream *)pQVar2,(QRectF *)r);
    pQVar6 = (QDataStream *)QDataStream::operator<<(pQVar6,iVar3);
  }
  else {
    pQVar6 = (QDataStream *)::operator<<((QDataStream *)pQVar2,(QRectF *)r);
    pQVar6 = ::operator<<(pQVar6,pm);
  }
  ::operator<<(pQVar6,(QRectF *)sr);
  writeCmdLength(this,pos,r,false);
  return;
}

Assistant:

void QPicturePaintEngine::drawPixmap(const QRectF &r, const QPixmap &pm, const QRectF &sr)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> drawPixmap():" << r;
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcDrawPixmap);

    if (d->pic_d->in_memory_only) {
        int index = d->pic_d->pixmap_list.size();
        d->pic_d->pixmap_list.append(pm);
        d->s << r << index << sr;
    } else {
        d->s << r << pm << sr;
    }
    writeCmdLength(pos, r, false);
}